

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::python::Generator::
ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,Generator *this,EnumDescriptor *descriptor)

{
  string *psVar1;
  AlphaNum *b;
  AlphaNum *in_R8;
  string_view separator;
  string_view filename;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [48];
  AlphaNum local_80;
  size_type local_50;
  char *local_48;
  
  separator._M_str = "_";
  separator._M_len = 1;
  NamePrefixedWithNestedTypes<google::protobuf::EnumDescriptor>
            (__return_storage_ptr__,descriptor,separator);
  absl::lts_20250127::AsciiStrToUpper(__return_storage_ptr__);
  local_50 = 1;
  local_48 = "_";
  local_80.piece_._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
  b = (AlphaNum *)__return_storage_ptr__->_M_string_length;
  local_80.piece_._M_len = (size_t)b;
  absl::lts_20250127::StrCat_abi_cxx11_((string *)local_b0,(lts_20250127 *)&local_50,&local_80,b);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (descriptor->file_ != this->file_) {
    psVar1 = descriptor->file_->name_;
    filename._M_str = (char *)b;
    filename._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
    python::(anonymous_namespace)::ModuleAlias_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)psVar1->_M_string_length,filename);
    local_50 = local_f0._M_string_length;
    local_48 = local_f0._M_dataplus._M_p;
    local_80.piece_._M_len = 1;
    local_80.piece_._M_str = ".";
    local_b0._8_8_ = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_b0._0_8_ = __return_storage_ptr__->_M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_d0,(lts_20250127 *)&local_50,&local_80,(AlphaNum *)local_b0,in_R8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelDescriptorName(
    const DescriptorT& descriptor) const {
  // FIXME(robinson):
  // We currently don't worry about collisions with underscores in the type
  // names, so these would collide in nasty ways if found in the same file:
  //   OuterProto.ProtoA.ProtoB
  //   OuterProto_ProtoA.ProtoB  # Underscore instead of period.
  // As would these:
  //   OuterProto.ProtoA_.ProtoB
  //   OuterProto.ProtoA._ProtoB  # Leading vs. trailing underscore.
  // (Contrived, but certainly possible).
  //
  // The C++ implementation doesn't guard against this either.  Leaving
  // it for now...
  std::string name = NamePrefixedWithNestedTypes(descriptor, "_");
  absl::AsciiStrToUpper(&name);
  // Module-private for now.  Easy to make public later; almost impossible
  // to make private later.
  name = absl::StrCat("_", name);
  // We now have the name relative to its own module.  Also qualify with
  // the module name iff this descriptor is from a different .proto file.
  if (descriptor.file() != file_) {
    name = absl::StrCat(ModuleAlias(descriptor.file()->name()), ".", name);
  }
  return name;
}